

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> * __thiscall
Pda::findEclosure(vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__return_storage_ptr__,
                 Pda *this,Node *n)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  reference ppNVar4;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *this_00;
  Node *pNVar5;
  Node *n_00;
  string *newTop;
  reference pvVar6;
  char *pcVar7;
  iterator __first;
  iterator __last;
  __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
  local_160;
  const_iterator local_158;
  byte local_149;
  stack<char,_std::deque<char,_std::allocator<char>_>_> local_148;
  stack<char,_std::deque<char,_std::allocator<char>_>_> local_f8;
  Node *local_a8;
  Node *next;
  char *e;
  reference ppTStack_90;
  char in;
  Transition **f;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *__range3;
  Node **node;
  iterator __end2;
  iterator __begin2;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__range2;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> newclosure;
  bool first;
  bool found;
  Node *local_20;
  Node *n_local;
  Pda *this_local;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *eclosure;
  
  local_20 = n;
  n_local = (Node *)this;
  this_local = (Pda *)__return_storage_ptr__;
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::vector(__return_storage_ptr__);
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back
            (__return_storage_ptr__,&local_20);
  newclosure.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  newclosure.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  while ((newclosure.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::vector
              ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2);
    newclosure.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __end2 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin(__return_storage_ptr__)
    ;
    node = (Node **)std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::end
                              (__return_storage_ptr__);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                                       *)&node), bVar2) {
      ppNVar4 = __gnu_cxx::
                __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                ::operator*(&__end2);
      this_00 = Tjen::Node::getTransitions(*ppNVar4);
      __end3 = std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::
               begin(this_00);
      f = (Transition **)
          std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::end
                    (this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                                         *)&f), bVar2) {
        ppTStack_90 = __gnu_cxx::
                      __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                      ::operator*(&__end3);
        e._7_1_ = (_Alloc_hider)Tjen::Node::Transition::getInput(*ppTStack_90);
        next = (Node *)anon_var_dwarf_e64d7;
        pNVar5 = (Node *)operator_new(0x88);
        n_00 = Tjen::Node::Transition::getTo(*ppTStack_90);
        Tjen::Node::Node(pNVar5,n_00);
        local_a8 = pNVar5;
        Tjen::Node::getStack(&local_f8,*ppNVar4);
        Tjen::Node::setStack(pNVar5,&local_f8);
        std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack(&local_f8);
        pNVar5 = local_a8;
        if (e._7_1_ == (next->name)._M_dataplus) {
          newTop = Tjen::Node::Transition::getNewstack_abi_cxx11_(*ppTStack_90);
          Tjen::Node::editStack(pNVar5,newTop);
          local_149 = 0;
          bVar3 = checkIfDouble(this,__return_storage_ptr__,local_a8);
          bVar2 = false;
          if (!bVar3) {
            Tjen::Node::getStack(&local_148,*ppNVar4);
            local_149 = 1;
            pvVar6 = std::stack<char,_std::deque<char,_std::allocator<char>_>_>::top(&local_148);
            cVar1 = *pvVar6;
            pcVar7 = Tjen::Node::Transition::getOldStack(*ppTStack_90);
            bVar2 = cVar1 == *pcVar7;
          }
          if ((local_149 & 1) != 0) {
            std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack(&local_148);
          }
          if (bVar2) {
            std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back
                      ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2,&local_a8);
            newclosure.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>::
      operator++(&__end2);
    }
    if ((newclosure.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0) {
      std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::pop_back(__return_storage_ptr__);
      newclosure.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
    }
    local_160._M_current =
         (Node **)std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin
                            (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<Tjen::Node*const*,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>::
    __normal_iterator<Tjen::Node**>
              ((__normal_iterator<Tjen::Node*const*,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>
                *)&local_158,&local_160);
    __first = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin
                        ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2);
    __last = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::end
                       ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2);
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
    insert<__gnu_cxx::__normal_iterator<Tjen::Node**,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>,void>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)__return_storage_ptr__,local_158,
               (__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                )__first._M_current,
               (__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                )__last._M_current);
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~vector
              ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2);
  }
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back
            (__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tjen::Node*> Pda::findEclosure(Tjen::Node *n) {

    std::vector<Tjen::Node *> eclosure; //totaal
    eclosure.push_back(n);

    bool found = true;
    bool first = true;
    while (found) {

        std::vector<Tjen::Node *> newclosure; //gevonden

        found = false;
        for (auto &node: eclosure) {
            for (auto &f: node->getTransitions()) {
                const char in = f->getInput();
                const char *e = "ε";

                Tjen::Node *next = new Tjen::Node(f->getTo());
                next->setStack(node->getStack());
                if (in == *e) {
                    next->editStack(f->getNewstack());

                    if (!checkIfDouble(eclosure, next) && node->getStack().top() == f->getOldStack()) {
                        newclosure.push_back(next);
                        found = true;
                    }

                }

            }
        }
        if (first) {
            eclosure.pop_back();
            first = false;
        }
        eclosure.insert(eclosure.begin(), newclosure.begin(), newclosure.end());
    }
    eclosure.push_back(n);
    return eclosure;
}